

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O0

Result __thiscall
wabt::interp::Memory::AtomicRmwCmpxchg<unsigned_int>
          (Memory *this,u64 offset,u64 addend,uint expect,uint replace,uint *out)

{
  bool bVar1;
  Result RVar2;
  uint local_3c;
  uint *puStack_38;
  uint read;
  uint *out_local;
  uint replace_local;
  uint expect_local;
  u64 addend_local;
  u64 offset_local;
  Memory *this_local;
  
  puStack_38 = out;
  out_local._0_4_ = replace;
  out_local._4_4_ = expect;
  _replace_local = addend;
  addend_local = offset;
  offset_local = (u64)this;
  RVar2 = AtomicLoad<unsigned_int>(this,offset,addend,&local_3c);
  bVar1 = Failed(RVar2);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    if (local_3c == out_local._4_4_) {
      RVar2 = AtomicStore<unsigned_int>(this,addend_local,_replace_local,(uint)out_local);
      bVar1 = Failed(RVar2);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        return (Result)this_local._4_4_;
      }
    }
    *puStack_38 = local_3c;
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result Memory::AtomicRmwCmpxchg(u64 offset,
                                u64 addend,
                                T expect,
                                T replace,
                                T* out) {
  T read;
  CHECK_RESULT(AtomicLoad(offset, addend, &read));
  if (read == expect) {
    CHECK_RESULT(AtomicStore(offset, addend, replace));
  }
  *out = read;
  return Result::Ok;
}